

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::SweepObject<(Memory::SweepMode)0>
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  size_t sizeOfObject;
  code *pcVar1;
  bool bVar2;
  uchar uVar3;
  undefined4 *puVar4;
  
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] != header
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x72f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if ((char)uVar3 < '\0') {
    return;
  }
  (&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] = (_func_int **)0x0;
  sizeOfObject = header->objectSize;
  if ((this->bucket->supportFreeList == false) &&
     (bVar2 = TrimObject(this,recycler,header,sizeOfObject,false), bVar2)) {
    return;
  }
  FillFreeMemory(this,recycler,header,sizeOfObject + 0x20);
  return;
}

Assistant:

void
LargeHeapBlock::SweepObject<SweepMode_InThread>(Recycler * recycler, LargeObjectHeader * header)
{
    Assert(this->HeaderList()[header->objectIndex] == header);

    // Set the header and object to null only if this is not a finalizable object
    // If it's finalizable, it'll be zeroed out during dispose
    if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) != FinalizeBit)
    {
        this->HeaderList()[header->objectIndex] = nullptr;

        size_t sizeOfObject = header->objectSize;

        bool objectTrimmed = false;

        if (!this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, sizeOfObject);
        }

        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + sizeOfObject);
        }
    }
}